

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

RecyclableObject *
Js::JavascriptOperators::OP_GetPrototype(Var instance,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  JavascriptLibrary *this;
  RecyclableObject *object;
  ScriptContext *scriptContext_local;
  Var instance_local;
  
  bVar1 = TaggedNumber::Is(instance);
  if (bVar1) {
    this = ScriptContext::GetLibrary(scriptContext);
    instance_local = JavascriptLibraryBase::GetNumberPrototype(&this->super_JavascriptLibraryBase);
  }
  else {
    instance_local = VarTo<Js::RecyclableObject>(instance);
    BVar2 = IsNull((RecyclableObject *)instance_local);
    if (BVar2 == 0) {
      instance_local = GetPrototype((RecyclableObject *)instance_local);
    }
  }
  return (RecyclableObject *)instance_local;
}

Assistant:

RecyclableObject* JavascriptOperators::OP_GetPrototype(Var instance, ScriptContext* scriptContext)
    {
        if (TaggedNumber::Is(instance))
        {
            return scriptContext->GetLibrary()->GetNumberPrototype();
        }
        else
        {
            RecyclableObject* object = VarTo<RecyclableObject>(instance);
            if (JavascriptOperators::IsNull(object))
            {
                return object;
            }

            return JavascriptOperators::GetPrototype(object);
        }
    }